

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

container_t *
container_remove_range(container_t *c,uint8_t type,uint32_t min,uint32_t max,uint8_t *result_type)

{
  uint32_t lenminusone;
  uint16_t uVar1;
  uint uVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint in_ECX;
  uint in_EDX;
  byte in_SIL;
  array_container_t *in_RDI;
  undefined1 *in_R8;
  run_container_t *run;
  int32_t result_cardinality_1;
  int32_t nvals_less;
  int32_t nvals_greater;
  array_container_t *array;
  int32_t result_cardinality;
  bitset_container_t *bitset;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffffa0;
  undefined2 uVar6;
  uint16_t in_stack_ffffffffffffffa2;
  undefined2 uVar7;
  uint64_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar8;
  undefined3 in_stack_ffffffffffffffec;
  undefined4 uVar9;
  array_container_t *local_8;
  
  uVar9 = CONCAT13(in_SIL,in_stack_ffffffffffffffec);
  uVar2 = (uint)in_SIL;
  local_8 = in_RDI;
  if (uVar2 == 1) {
    lenminusone = in_RDI->cardinality;
    uVar6 = (undefined2)lenminusone;
    uVar7 = (undefined2)(lenminusone >> 0x10);
    iVar3 = bitset_lenrange_cardinality(in_stack_ffffffffffffffa8,1,lenminusone);
    iVar3 = CONCAT22(uVar7,uVar6) - iVar3;
    if (iVar3 == 0) {
      local_8 = (array_container_t *)0x0;
    }
    else if (iVar3 < 0x1001) {
      *in_R8 = 2;
      bitset_reset_range((uint64_t *)in_RDI->array,in_EDX,in_ECX + 1);
      in_RDI->cardinality = iVar3;
      local_8 = array_container_from_bitset
                          ((bitset_container_t *)CONCAT44(uVar2,CONCAT22(uVar7,uVar6)));
    }
    else {
      *in_R8 = 1;
      bitset_reset_range((uint64_t *)in_RDI->array,in_EDX,in_ECX + 1);
      in_RDI->cardinality = iVar3;
    }
  }
  else if (uVar2 == 2) {
    iVar4 = count_greater((uint16_t *)in_stack_ffffffffffffffa8,2,in_stack_ffffffffffffffa2);
    iVar5 = count_less((uint16_t *)in_stack_ffffffffffffffa8,uVar2,in_stack_ffffffffffffffa2);
    if (iVar5 + iVar4 == 0) {
      local_8 = (array_container_t *)0x0;
    }
    else {
      *in_R8 = 2;
      array_container_remove_range
                ((array_container_t *)
                 CONCAT44(uVar2,CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)),
                 in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    }
  }
  else if (in_RDI->cardinality == 0) {
    local_8 = (array_container_t *)0x0;
  }
  else {
    uVar8 = in_EDX;
    uVar1 = run_container_minimum((run_container_t *)in_RDI);
    uVar2 = in_ECX;
    if ((in_EDX <= uVar1) &&
       (uVar1 = run_container_maximum((run_container_t *)in_RDI), uVar1 <= in_ECX)) {
      return (container_t *)0x0;
    }
    run_container_remove_range
              ((run_container_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
    local_8 = (array_container_t *)
              convert_run_to_efficient_container
                        ((run_container_t *)CONCAT44(uVar9,uVar8),
                         (uint8_t *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  }
  return local_8;
}

Assistant:

static inline container_t *container_remove_range(container_t *c, uint8_t type,
                                                  uint32_t min, uint32_t max,
                                                  uint8_t *result_type) {
    switch (type) {
        case BITSET_CONTAINER_TYPE: {
            bitset_container_t *bitset = CAST_bitset(c);

            int32_t result_cardinality =
                bitset->cardinality -
                bitset_lenrange_cardinality(bitset->words, min, max - min);

            if (result_cardinality == 0) {
                return NULL;
            } else if (result_cardinality <= DEFAULT_MAX_SIZE) {
                *result_type = ARRAY_CONTAINER_TYPE;
                bitset_reset_range(bitset->words, min, max + 1);
                bitset->cardinality = result_cardinality;
                return array_container_from_bitset(bitset);
            } else {
                *result_type = BITSET_CONTAINER_TYPE;
                bitset_reset_range(bitset->words, min, max + 1);
                bitset->cardinality = result_cardinality;
                return bitset;
            }
        }
        case ARRAY_CONTAINER_TYPE: {
            array_container_t *array = CAST_array(c);

            int32_t nvals_greater =
                count_greater(array->array, array->cardinality, (uint16_t)max);
            int32_t nvals_less =
                count_less(array->array, array->cardinality - nvals_greater,
                           (uint16_t)min);
            int32_t result_cardinality = nvals_less + nvals_greater;

            if (result_cardinality == 0) {
                return NULL;
            } else {
                *result_type = ARRAY_CONTAINER_TYPE;
                array_container_remove_range(
                    array, nvals_less, array->cardinality - result_cardinality);
                return array;
            }
        }
        case RUN_CONTAINER_TYPE: {
            run_container_t *run = CAST_run(c);

            if (run->n_runs == 0) {
                return NULL;
            }
            if (min <= run_container_minimum(run) &&
                max >= run_container_maximum(run)) {
                return NULL;
            }

            run_container_remove_range(run, min, max);
            return convert_run_to_efficient_container(run, result_type);
        }
        default:
            roaring_unreachable;
    }
}